

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_archive.cpp
# Opt level: O3

uint __thiscall
ON_BinaryArchive::Dump3dmChunk(ON_BinaryArchive *this,ON_TextLog *dump,int recursion_depth)

{
  ulong uVar1;
  ON_UUID uuid;
  uint uVar2;
  bool bVar3;
  uint uVar4;
  char *pcVar5;
  ON_ClassId *this_00;
  char *pcVar6;
  int ioffset;
  ulong uVar7;
  uint typecode;
  int minor_userdata_version;
  int major_userdata_version;
  ON__INT64 big_value;
  int layer_index;
  ON__UINT64 sizeof_file;
  int mn;
  int mj;
  uchar in_stack_ffffffffffffff88 [8];
  uint local_64;
  uint local_60;
  uint local_5c;
  uchar local_58 [8];
  uint local_4c;
  ON_UUID local_48;
  int local_38 [2];
  
  uVar7 = this->m_current_positionX;
  local_64 = 0;
  bVar3 = BeginRead3dmBigChunk(this,&local_64,(ON__INT64 *)local_58);
  if (!bVar3) {
    pcVar6 = "BeginRead3dmChunk() failed.";
    goto LAB_003ad31f;
  }
  if (local_64 == 0) {
    pcVar6 = "BeginRead3dmChunk() returned typecode = 0.";
LAB_003ad432:
    ON_TextLog::Print(dump,"** ERROR near offset %d ** %s\n",uVar7 & 0xffffffff,pcVar6);
    EndRead3dmChunk(this,false);
    return 0;
  }
  if (recursion_depth == 0) {
    ON_TextLog::Print(dump,"\n");
  }
  uVar2 = local_64;
  pcVar5 = TypecodeName(local_64);
  pcVar6 = "unknown tcode";
  if (pcVar5 != (char *)0x0) {
    pcVar6 = pcVar5;
  }
  if ((int)uVar2 < 0) {
    pcVar5 = "%6d: %08X %s: value = %lld (%016llX)\n";
    in_stack_ffffffffffffff88 = local_58;
  }
  else {
    if ((long)local_58 < 0) {
      pcVar6 = "BeginRead3dmChunk() returned length < 0.";
      goto LAB_003ad432;
    }
    pcVar5 = "%6d: %08X %s: length = %lld bytes\n";
  }
  ON_TextLog::Print(dump,pcVar5,uVar7,(ulong)uVar2,pcVar6);
  local_5c = 0xffffffff;
  local_60 = 0xffffffff;
  if ((int)local_64 < 0x20008040) {
    if ((int)local_64 < 0x2fffb) {
      if ((int)local_64 < 0x27ffa) {
        if (local_64 - 0x7ffe < 2) {
          ON_TextLog::PushIndent(dump);
          if ((long)local_58 < 4) {
            pcVar6 = "TCODE_ENDOFFILE chunk withlength < 4.";
            goto LAB_003ad8d0;
          }
          local_48.Data1 = 0;
          local_48.Data2 = 0;
          local_48.Data3 = 0;
          ReadEOFSizeOfFile(this,(ON__UINT64 *)&local_48);
          ON_TextLog::Print(dump,"current position = %d  stored size = %llu\n",
                            this->m_current_positionX,local_48._0_8_);
          goto LAB_003ad969;
        }
        if (local_64 == 0xa0000026) {
          ON_TextLog::PushIndent(dump);
          ON_TextLog::Print(dump,"Version of opennurbs that wrote this file: %lld\n",local_58);
          ON_TextLog::PopIndent(dump);
          if ((long)local_58 - 1U >> 1 < 0x7fffffff && this->m_3dm_opennurbs_version == 0) {
            ON_SetBinaryArchiveOpenNURBSVersion(this,local_58._0_4_);
          }
        }
      }
      else {
        if (local_64 == 0x27ffa) {
          ON_TextLog::PushIndent(dump);
LAB_003ad723:
          do {
            uVar4 = Dump3dmChunk(this,dump,recursion_depth + 1);
            if ((int)uVar4 < 0x2fffb) goto LAB_003ad744;
          } while (uVar4 - 0x2fffb < 2);
          goto LAB_003ad75e;
        }
        if (local_64 == 0x27ffd) {
          bVar3 = Read3dmChunkVersion(this,(int *)&local_5c,(int *)&local_60);
          if (bVar3) {
            ON_TextLog::PushIndent(dump);
            ON_TextLog::Print(dump,"UserData chunk version: %d.%d\n",(ulong)local_5c,(ulong)local_60
                             );
            if (((local_5c - 1 < 2) &&
                (bVar3 = Dump3dmChunk_UserDataHeaderHelper
                                   (this->m_current_positionX,this,local_5c,local_60,dump), bVar3))
               && (uVar4 = Dump3dmChunk(this,dump,recursion_depth + 1), uVar4 != 0x40008000)) {
              pcVar6 = "Userdata Expected a TCODE_ANONYMOUS_CHUNK chunk.";
              goto LAB_003ad8d0;
            }
            goto LAB_003ad969;
          }
          pcVar6 = 
          "Read3dmChunkVersion() failed to read TCODE_OPENNURBS_CLASS_USERDATA chunk version.";
        }
        else {
          if (local_64 != 0x2fff9) goto switchD_003ad3f5_caseD_20008071;
          pcVar6 = 
          "Encountered TCODE_OPENNURBS_CLASS_USERDATA_HEADER chunk outside a TCODE_OPENNURBS_CLASS_USERDATA chunk."
          ;
        }
        ON_TextLog::Print(dump,"** ERROR near offset %d ** %s\n",uVar7 & 0xffffffff,pcVar6);
      }
      goto switchD_003ad3f5_caseD_20008071;
    }
    if ((local_64 + 0xeffffff0 < 0x17) && ((0x6f03ffU >> (local_64 + 0xeffffff0 & 0x1f) & 1) != 0))
    {
      ON_TextLog::PushIndent(dump);
      do {
        uVar4 = Dump3dmChunk(this,dump,recursion_depth + 1);
      } while (1 < uVar4 + 1);
    }
    else {
      if (local_64 == 0x2fffb) goto switchD_003ad3f5_caseD_20008080;
      if (local_64 != 0x2008072) goto switchD_003ad3f5_caseD_20008071;
      ON_TextLog::PushIndent(dump);
      if ((long)local_58 < 0xe) {
        pcVar6 = "Length of chunk is too small.  Should be >= 14.";
      }
      else {
        local_48.Data1 = 0;
        local_48.Data2 = 0;
        local_48.Data3 = 0;
        local_48.Data4[0] = '\0';
        local_48.Data4[1] = '\0';
        local_48.Data4[2] = '\0';
        local_48.Data4[3] = '\0';
        local_48.Data4[4] = '\0';
        local_48.Data4[5] = '\0';
        local_48.Data4[6] = '\0';
        local_48.Data4[7] = '\0';
        local_4c = 0xffffff9d;
        local_38[1] = 0xffffffff;
        local_38[0] = -1;
        bVar3 = Read3dmChunkVersion(this,local_38 + 1,local_38);
        if (bVar3) {
          bVar3 = ReadUuid(this,&local_48);
          if (!bVar3) goto LAB_003ad8c2;
          bVar3 = ReadInt32(this,1,(ON__INT32 *)&local_4c);
          if (bVar3) {
            ON_TextLog::Print(dump,"Rhino object uuid: ");
            ON_TextLog::Print(dump,&local_48);
            ON_TextLog::Print(dump,"\n");
            ON_TextLog::Print(dump,"layer index: %d\n",(ulong)local_4c);
            goto LAB_003ad969;
          }
          pcVar6 = "ReadInt() failed to read layer index.";
        }
        else {
          pcVar6 = "Read3dmChunkVersion() failed.";
        }
      }
LAB_003ad8d0:
      ON_TextLog::Print(dump,"** ERROR near offset %d ** %s\n",uVar7 & 0xffffffff,pcVar6);
    }
LAB_003ad969:
    ON_TextLog::PopIndent(dump);
  }
  else if ((int)local_64 < 0x20008070) {
    if ((local_64 == 0x20008040) || (local_64 == 0x20008050)) goto switchD_003ad3f5_caseD_20008073;
    if (local_64 == 0x20008060) {
      ON_TextLog::PushIndent(dump);
LAB_003ad4ff:
      do {
        uVar4 = Dump3dmChunk(this,dump,recursion_depth + 1);
        if ((int)uVar4 < 0x2000062) goto LAB_003ad524;
      } while ((uVar4 == 0x2000062) || (uVar4 == 0x2008061));
      goto LAB_003ad53e;
    }
  }
  else {
    switch(local_64) {
    case 0x20008070:
      ON_TextLog::PushIndent(dump);
LAB_003ad798:
      do {
        uVar4 = Dump3dmChunk(this,dump,recursion_depth + 1);
        if (0x27ff9 < (int)uVar4) goto LAB_003ad7c8;
      } while (uVar4 == 0x82000071);
      if ((uVar4 != 0x8200007f) && (uVar4 != 0)) goto LAB_003ad7dd;
      goto LAB_003ad969;
    case 0x20008071:
    case 0x20008072:
    case 0x20008078:
    case 0x20008079:
    case 0x2000807c:
    case 0x2000807d:
    case 0x2000807e:
    case 0x2000807f:
      break;
    case 0x20008073:
    case 0x20008074:
    case 0x20008075:
    case 0x20008076:
    case 0x20008077:
    case 0x2000807a:
    case 0x2000807b:
switchD_003ad3f5_caseD_20008073:
      ON_TextLog::PushIndent(dump);
      uVar4 = Dump3dmChunk(this,dump,recursion_depth + 1);
      if (local_64 == 0) {
        local_64 = uVar4;
      }
      goto LAB_003ad969;
    case 0x20008080:
switchD_003ad3f5_caseD_20008080:
      ON_TextLog::PushIndent(dump);
      local_48.Data1 = 0;
      local_48.Data2 = 0;
      local_48.Data3 = 0;
      local_48.Data4[0] = '\0';
      local_48.Data4[1] = '\0';
      local_48.Data4[2] = '\0';
      local_48.Data4[3] = '\0';
      local_48.Data4[4] = '\0';
      local_48.Data4[5] = '\0';
      local_48.Data4[6] = '\0';
      local_48.Data4[7] = '\0';
      bVar3 = ReadUuid(this,&local_48);
      if (!bVar3) {
LAB_003ad8c2:
        pcVar6 = "ReadUuid() failed.";
        goto LAB_003ad8d0;
      }
      if (local_64 == 0x2fffb) {
        ON_TextLog::Print(dump,"OpenNURBS class id = ");
        uuid.Data4[0] = in_stack_ffffffffffffff88[0];
        uuid.Data4[1] = in_stack_ffffffffffffff88[1];
        uuid.Data4[2] = in_stack_ffffffffffffff88[2];
        uuid.Data4[3] = in_stack_ffffffffffffff88[3];
        uuid.Data4[4] = in_stack_ffffffffffffff88[4];
        uuid.Data4[5] = in_stack_ffffffffffffff88[5];
        uuid.Data4[6] = in_stack_ffffffffffffff88[6];
        uuid.Data4[7] = in_stack_ffffffffffffff88[7];
        uuid.Data1 = 0x3ad904;
        uuid.Data2 = 0;
        uuid.Data3 = 0;
        this_00 = ON_ClassId::ClassId(uuid);
        ON_TextLog::Print(dump,&local_48);
        if ((this_00 != (ON_ClassId *)0x0) &&
           (pcVar6 = ON_ClassId::ClassName(this_00), pcVar6 != (char *)0x0)) {
          ON_TextLog::Print(dump," (%s)",pcVar6);
        }
      }
      else {
        if (local_64 == 0x20008080) {
          pcVar6 = "User table id = ";
        }
        else {
          pcVar6 = "UUID = ";
        }
        ON_TextLog::Print(dump,pcVar6);
        ON_TextLog::Print(dump,&local_48);
      }
      ON_TextLog::Print(dump,"\n");
      goto LAB_003ad969;
    default:
      if (local_64 == 0x20008090) goto switchD_003ad3f5_caseD_20008073;
    }
  }
switchD_003ad3f5_caseD_20008071:
  uVar1 = this->m_current_positionX;
  bVar3 = EndRead3dmChunk(this,true);
  if (bVar3) {
    if ((int)uVar2 < 0) {
      return local_64;
    }
    if (-1 < (long)((uVar7 - uVar1) + (long)local_58 + (ulong)(0x31 < this->m_3dm_version) * 4 + 8))
    {
      return local_64;
    }
    pcVar6 = "Read beyond end of chunk.";
  }
  else {
    pcVar6 = "EndRead3dmChunk() failed.";
    uVar7 = uVar1;
  }
LAB_003ad31f:
  ON_TextLog::Print(dump,"** ERROR near offset %d ** %s\n",uVar7 & 0xffffffff,pcVar6);
  return local_64;
LAB_003ad524:
  if (uVar4 != 0x27ffa) {
    if ((uVar4 == 0x8200006f) || (uVar4 == 0)) goto LAB_003ad969;
LAB_003ad53e:
    ON_TextLog::Print(dump,"** ERROR near offset %d ** %s\n",uVar7 & 0xffffffff,
                      "Rogue chunk in light record.");
  }
  goto LAB_003ad4ff;
LAB_003ad7c8:
  if (((uVar4 != 0x27ffa) && (uVar4 != 0x2000073)) && (uVar4 != 0x2008072)) {
LAB_003ad7dd:
    ON_TextLog::Print(dump,"** ERROR near offset %d ** %s\n",uVar7 & 0xffffffff,
                      "Rogue chunk in object record.");
  }
  goto LAB_003ad798;
LAB_003ad744:
  if (uVar4 != 0x27ffd) {
    if ((uVar4 == 0x80027fff) || (uVar4 == 0)) goto LAB_003ad969;
LAB_003ad75e:
    ON_TextLog::Print(dump,"** ERROR near offset %d ** %s\n",uVar7 & 0xffffffff,
                      "Rogue chunk in OpenNURBS class record.");
  }
  goto LAB_003ad723;
}

Assistant:

unsigned int 
ON_BinaryArchive::Dump3dmChunk( ON_TextLog& dump, int recursion_depth )
{
  //ON_BinaryArchive& file = *this;
  const char* typecode_name = 0;
  bool bShortChunk = false;
  const ON__UINT64 offset0 = CurrentPosition();
  unsigned int typecode = 0;
  ON__INT64 big_value;
  bool rc = BeginRead3dmBigChunk( &typecode, &big_value );
  if (!rc) 
  {
    Dump3dmChunk_ErrorReportHelper(offset0,"BeginRead3dmChunk() failed.",dump);
  }
  else 
  {
    if ( 0 == typecode ) 
    {
      Dump3dmChunk_ErrorReportHelper(offset0,"BeginRead3dmChunk() returned typecode = 0.",dump);
      EndRead3dmChunk();
      return 0;
    }
    else {
      if ( 0 == recursion_depth )
      {
        dump.Print("\n");
      }

      ////bShortChunk = (0 != (typecode & TCODE_SHORT));
      typecode_name = ON_BinaryArchive::TypecodeName(typecode);
      bShortChunk = (0 != (typecode & TCODE_SHORT));
      if ( !DumpChunk_PrintHeaderInfo(offset0,typecode,big_value,typecode_name,dump) )
      {
        EndRead3dmChunk();
        return 0;
      }

      int major_userdata_version = -1;
      int minor_userdata_version = -1;

      switch( typecode ) 
      {
      case TCODE_PROPERTIES_TABLE:
      case TCODE_SETTINGS_TABLE:
      case TCODE_BITMAP_TABLE:
      case TCODE_MATERIAL_TABLE:
      case TCODE_LAYER_TABLE:
      case TCODE_GROUP_TABLE:
      case TCODE_LIGHT_TABLE:
      case TCODE_FONT_TABLE:
      case TCODE_DIMSTYLE_TABLE:
      case TCODE_HATCHPATTERN_TABLE:
      case TCODE_LINETYPE_TABLE:
      case TCODE_TEXTURE_MAPPING_TABLE:
      case TCODE_HISTORYRECORD_TABLE:
      case TCODE_USER_TABLE:
      case TCODE_INSTANCE_DEFINITION_TABLE:
      case TCODE_OBJECT_TABLE:
        // start of a table
        {
          dump.PushIndent();
          unsigned int record_typecode = 0;
          for (;;) {
            record_typecode = Dump3dmChunk( dump, recursion_depth+1 );
            if ( !record_typecode ) {
              break;
            }
            if ( TCODE_ENDOFTABLE == record_typecode ) {
              break;
            }
          }
          dump.PopIndent();
        }
        break;

      case TCODE_PROPERTIES_OPENNURBS_VERSION:
        {
          dump.PushIndent();
          dump.Print("Version of opennurbs that wrote this file: %lld\n",big_value);
          dump.PopIndent();           
          if (0 == m_3dm_opennurbs_version && big_value > 0 && ((ON__UINT64)big_value) < ON_UNSET_UINT_INDEX)
            ON_SetBinaryArchiveOpenNURBSVersion(*this,(ON__UINT32)big_value);
        }
        break;

      case TCODE_BITMAP_RECORD:
        {
          dump.PushIndent();
          unsigned int bitmap_chunk_typecode = Dump3dmChunk( dump, recursion_depth+1 );
          if ( 0 == typecode )
            typecode = bitmap_chunk_typecode;
          dump.PopIndent();
        }
        break;

      case TCODE_MATERIAL_RECORD:
        {
          dump.PushIndent();
          unsigned int material_chunk_typecode = Dump3dmChunk( dump, recursion_depth+1 );
          if ( 0 == typecode )
            typecode = material_chunk_typecode;
          dump.PopIndent();
        }
        break;

      case TCODE_LAYER_RECORD:
        {
          dump.PushIndent();
          unsigned int material_chunk_typecode = Dump3dmChunk( dump, recursion_depth+1 );
          if ( 0 == typecode )
            typecode = material_chunk_typecode;
          dump.PopIndent();
        }
        break;

      case TCODE_GROUP_RECORD:
        {
          dump.PushIndent();
          unsigned int group_chunk_typecode = Dump3dmChunk( dump, recursion_depth+1 );
          if ( 0 == typecode )
            typecode = group_chunk_typecode;
          dump.PopIndent();
        }
        break;

      case TCODE_FONT_RECORD:
        {
          dump.PushIndent();
          unsigned int font_chunk_typecode = Dump3dmChunk( dump, recursion_depth+1 );
          if ( 0 == typecode )
            typecode = font_chunk_typecode;
          dump.PopIndent();
        }
        break;

      case TCODE_DIMSTYLE_RECORD:
        {
          dump.PushIndent();
          unsigned int dimstyle_chunk_typecode = Dump3dmChunk( dump, recursion_depth+1 );
          if ( 0 == typecode )
            typecode = dimstyle_chunk_typecode;
          dump.PopIndent();
        }
        break;

      case TCODE_LIGHT_RECORD:
        {
          dump.PushIndent();
          unsigned int light_chunk_typecode = 0;
          for (;;) {
            light_chunk_typecode = Dump3dmChunk( dump, recursion_depth+1 );
            if ( !light_chunk_typecode ) {
              break;
            }
            if ( TCODE_LIGHT_RECORD_END == light_chunk_typecode ) {
              break;
            }
            switch( light_chunk_typecode ) {
            //case TCODE_OBJECT_RECORD_TYPE:
            case TCODE_LIGHT_RECORD_ATTRIBUTES:
            case TCODE_LIGHT_RECORD_ATTRIBUTES_USERDATA:
            case TCODE_OPENNURBS_CLASS:
              break;
            default:
              {
                Dump3dmChunk_ErrorReportHelper(offset0,"Rogue chunk in light record.",dump);
              }
            }
          }
          dump.PopIndent();
        }
        break;

      case TCODE_TEXTURE_MAPPING_RECORD:
        {
          dump.PushIndent();
          unsigned int mapping_chunk_typecode = Dump3dmChunk( dump, recursion_depth+1 );
          if ( !typecode )
            typecode = mapping_chunk_typecode;
          dump.PopIndent();
        }
        break;

      case TCODE_HISTORYRECORD_RECORD:
        {
          dump.PushIndent();
          unsigned int history_chunk_typecode = Dump3dmChunk( dump, recursion_depth+1 );
          if ( !typecode )
            typecode = history_chunk_typecode;
          dump.PopIndent();
        }
        break;

      case TCODE_HATCHPATTERN_RECORD:
        {
          dump.PushIndent();
          unsigned int hatch_chunk_typecode = Dump3dmChunk( dump, recursion_depth+1 );
          if ( !typecode )
            typecode = hatch_chunk_typecode;
          dump.PopIndent();
        }
        break;

      case TCODE_INSTANCE_DEFINITION_RECORD:
        {
          dump.PushIndent();
          unsigned int idef_chunk_typecode = Dump3dmChunk( dump, recursion_depth+1 );
          if ( 0 == typecode )
            typecode = idef_chunk_typecode;
          dump.PopIndent();
        }
        break;

      case TCODE_OBJECT_RECORD:
        {
          dump.PushIndent();
          unsigned int object_chunk_typecode = 0;
          for (;;) {
            object_chunk_typecode = Dump3dmChunk( dump, recursion_depth+1 );
            if ( !object_chunk_typecode ) {
              break;
            }
            if ( TCODE_OBJECT_RECORD_END == object_chunk_typecode ) {
              break;
            }
            switch( object_chunk_typecode ) {
            case TCODE_OBJECT_RECORD_TYPE:
            case TCODE_OBJECT_RECORD_ATTRIBUTES:
            case TCODE_OBJECT_RECORD_ATTRIBUTES_USERDATA:
            case TCODE_OPENNURBS_CLASS:
              break;
            default:
              {
                Dump3dmChunk_ErrorReportHelper(offset0,"Rogue chunk in object record.",dump);
              }
            }
          }
          dump.PopIndent();
        }
        break;

      case TCODE_OBJECT_RECORD_ATTRIBUTES:
        {
          dump.PushIndent();
          if ( big_value < 14 )
          {
            Dump3dmChunk_ErrorReportHelper(offset0,"Length of chunk is too small.  Should be >= 14.",dump);
          }
          else
          {
            ON_UUID uuid = ON_nil_uuid;
            int layer_index = -99;
            int mj = -1;
            int mn = -1;
            if ( !Read3dmChunkVersion(&mj,&mn))
            {
              Dump3dmChunk_ErrorReportHelper(offset0,"Read3dmChunkVersion() failed.",dump);
            }
            else if (!ReadUuid(uuid))
            {
              Dump3dmChunk_ErrorReportHelper(offset0,"ReadUuid() failed.",dump);
            }
            else if ( !ReadInt(&layer_index) )
            {
              Dump3dmChunk_ErrorReportHelper(offset0,"ReadInt() failed to read layer index.",dump);
            }
            else
            {
              dump.Print("Rhino object uuid: ");
              dump.Print(uuid);
              dump.Print("\n");
              dump.Print("layer index: %d\n",layer_index);
            }
          }
          dump.PopIndent();
        }
        break;

      case TCODE_OPENNURBS_CLASS:
        {
          dump.PushIndent();
          unsigned int opennurbs_object_chunk_typecode = 0;
          for (;;) {
            opennurbs_object_chunk_typecode = Dump3dmChunk( dump, recursion_depth+1  );
            if ( !opennurbs_object_chunk_typecode ) {
              break;
            }
            if ( TCODE_OPENNURBS_CLASS_END == opennurbs_object_chunk_typecode ) {
              break;
            }
            switch( opennurbs_object_chunk_typecode ) 
            {
            case TCODE_OPENNURBS_CLASS_UUID:
              break;
            case TCODE_OPENNURBS_CLASS_DATA:
              break;
            case TCODE_OPENNURBS_CLASS_USERDATA:
              break;
            default:
              {
                Dump3dmChunk_ErrorReportHelper(offset0,"Rogue chunk in OpenNURBS class record.",dump);
              }
            }
          }
          dump.PopIndent();
        }
        break;

      case TCODE_OPENNURBS_CLASS_USERDATA:
        {
          if ( !Read3dmChunkVersion(&major_userdata_version, &minor_userdata_version ) )
          {
            Dump3dmChunk_ErrorReportHelper(offset0,"Read3dmChunkVersion() failed to read TCODE_OPENNURBS_CLASS_USERDATA chunk version.",dump);
          }
          else
          {
            dump.PushIndent();
            dump.Print("UserData chunk version: %d.%d\n",
                       major_userdata_version,
                       minor_userdata_version
                       );
            if ( 1 == major_userdata_version || 2 == major_userdata_version )
            {
              const ON__UINT64 userdata_header_offset = CurrentPosition();
              switch ( major_userdata_version )
              {
              case 1:
              case 2:
                {
                  // version 1 user data header information was not wrapped
                  // in a chunk.
                  //
                  // version 2 user data header information is wrapped
                  // in a TCODE_OPENNURBS_CLASS_USERDATA_HEADER chunk.
                  if ( Dump3dmChunk_UserDataHeaderHelper( 
                                  userdata_header_offset, *this, 
                                  major_userdata_version, minor_userdata_version,
                                  dump ) 
                     )
                  {
                    // a TCODE_ANONYMOUS_CHUNK contains user data goo
                    int anon_typecode =  Dump3dmChunk( dump, recursion_depth+1 );
                    if ( TCODE_ANONYMOUS_CHUNK != anon_typecode )
                    {
                      Dump3dmChunk_ErrorReportHelper( offset0,"Userdata Expected a TCODE_ANONYMOUS_CHUNK chunk.",dump);
                    }
                  }
                }
                break;
              default:
                if ( major_userdata_version < 3 )
                {
                }
                else
                {
                  dump.Print("New user data format created after this diagnostic tool was written.\n");
                }
                break;
              }
            }

            dump.PopIndent();
          }
        }
        break;

      case TCODE_OPENNURBS_CLASS_UUID:
      case TCODE_USER_TABLE_UUID:
        {
          dump.PushIndent();
          ON_UUID uuid = ON_nil_uuid;
          const ON_ClassId* pClassId = 0;
          if ( !ReadUuid( uuid ) ) {
             Dump3dmChunk_ErrorReportHelper(offset0,"ReadUuid() failed.",dump);
          }
          else 
          {
            if ( typecode == TCODE_OPENNURBS_CLASS_UUID ) 
            {
              dump.Print("OpenNURBS class id = ");
              pClassId = ON_ClassId::ClassId(uuid);
            }
            else if ( typecode == TCODE_USER_TABLE_UUID ) 
            {
              dump.Print("User table id = ");
            }
            else {
              dump.Print("UUID = ");
            }
            dump.Print( uuid );
            if ( pClassId )
            {
              const char* sClassName = pClassId->ClassName();
              if ( sClassName )
              {
                dump.Print(" (%s)",sClassName);
              }
            }
            dump.Print("\n");
          }

          dump.PopIndent();
        }
        break;

      case TCODE_OPENNURBS_CLASS_USERDATA_HEADER:
        {
          // we should never get here because this chunk is parsed in the TCODE_OPENNURBS_CLASS_USERDATA case above.
          Dump3dmChunk_ErrorReportHelper(offset0,"Encountered TCODE_OPENNURBS_CLASS_USERDATA_HEADER chunk outside a TCODE_OPENNURBS_CLASS_USERDATA chunk.",dump);
        }
        break;

      case TCODE_ENDOFFILE:
      case TCODE_ENDOFFILE_GOO:
        {
          dump.PushIndent();
          if ( big_value < 4 ) {
            Dump3dmChunk_ErrorReportHelper(offset0,"TCODE_ENDOFFILE chunk withlength < 4.",dump);
          }
          else {
            ON__UINT64 sizeof_file = 0;
            ReadEOFSizeOfFile(&sizeof_file);
            dump.Print("current position = %d  stored size = %llu\n",
                       CurrentPosition(), 
                       sizeof_file
                       );
          }
          dump.PopIndent();
        }
        break;

      }
    }

    const ON__UINT64 offset1 = CurrentPosition();
    if ( !EndRead3dmChunk(true) ) 
    {
      Dump3dmChunk_ErrorReportHelper(offset1,"EndRead3dmChunk() failed.",dump);
      rc = false;
    }
    else if (!bShortChunk) 
    {
      ON__INT64 delta =  (offset1 > offset0)
                ?  ((ON__INT64)(offset1 - offset0))
                : -((ON__INT64)(offset0 - offset1));
      const ON__INT64 extra = big_value - (delta-4-SizeofChunkLength());
      if ( extra < 0 ) 
      {
        Dump3dmChunk_ErrorReportHelper(offset0,"Read beyond end of chunk.",dump);
      }
    }
  }
  return typecode;
}